

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::mipmapped_texture::resize
          (mipmapped_texture *this,uint new_width,uint new_height,resample_params *params)

{
  elemental_vector *this_00;
  uint min_new_capacity;
  int iVar1;
  color_quad<unsigned_char,_int> *p;
  mip_level *this_01;
  void *p_00;
  vector<crnlib::mip_level_*> *pvVar2;
  bool bVar3;
  undefined8 *puVar4;
  image_u8 *src;
  image_u8 *dst;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint f;
  ulong uVar9;
  ulong uVar10;
  face_vec faces;
  resample_params rparams;
  image_u8 tmp;
  face_vec local_c8;
  uint local_ac;
  mipmapped_texture *local_a8;
  uint local_a0;
  uint local_9c;
  resample_params local_98;
  resample_params *local_70;
  image_u8 local_68;
  
  min_new_capacity = (this->m_faces).m_size;
  if (min_new_capacity == 0) {
    bVar5 = 0;
  }
  else {
    local_c8.m_p = (vector<crnlib::mip_level_*> *)0x0;
    local_c8.m_size = 0;
    local_c8.m_capacity = 0;
    local_a8 = this;
    local_a0 = new_width;
    local_9c = new_height;
    local_70 = params;
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_c8,min_new_capacity,min_new_capacity == 1,0x10,
               (object_mover)0x0,false);
    if (min_new_capacity != local_c8.m_size) {
      memset(local_c8.m_p + (local_c8._8_8_ & 0xffffffff),0,
             (ulong)(min_new_capacity - local_c8.m_size) << 4);
    }
    local_c8.m_size = min_new_capacity;
    lVar7 = 0;
    uVar9 = 0;
    do {
      iVar1 = *(int *)((long)&(local_c8.m_p)->m_size + lVar7);
      if (iVar1 != 1) {
        this_00 = (elemental_vector *)((long)&(local_c8.m_p)->m_p + lVar7);
        if (iVar1 == 0) {
          if (*(int *)((long)&(local_c8.m_p)->m_capacity + lVar7) == 0) {
            elemental_vector::increase_capacity(this_00,1,true,8,(object_mover)0x0,false);
          }
          memset((void *)((ulong)this_00->m_size * 8 + (long)this_00->m_p),0,
                 (ulong)(1 - this_00->m_size) << 3);
        }
        this_00->m_size = 1;
      }
      puVar4 = (undefined8 *)crnlib_malloc(0x28);
      *puVar4 = 0;
      *(undefined4 *)(puVar4 + 1) = 0xf;
      *(undefined8 *)((long)puVar4 + 0xc) = 0;
      *(undefined8 *)((long)puVar4 + 0x14) = 0;
      *(undefined8 *)((long)puVar4 + 0x1c) = 0;
      **(undefined8 **)((long)&(local_c8.m_p)->m_p + lVar7) = puVar4;
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar9 < (local_c8._8_8_ & 0xffffffff));
    uVar6 = CONCAT31((int3)(min_new_capacity >> 8),local_c8.m_size == 0);
    uVar9 = (ulong)uVar6;
    if (local_c8.m_size != 0) {
      uVar8 = 0;
      do {
        local_68.m_width = 0;
        local_68.m_height = 0;
        local_68.m_pitch = 0;
        local_68.m_total = 0;
        local_68.m_comp_flags = 0xf;
        local_68.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
        local_68.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
        local_68.m_pixel_buf.m_size = 0;
        local_68.m_pixel_buf.m_capacity = 0;
        src = mip_level::get_unpacked_image(*(local_a8->m_faces).m_p[uVar8].m_p,&local_68,1);
        local_ac = (uint)uVar9;
        dst = (image_u8 *)crnlib_malloc(0x30);
        dst->m_width = 0;
        dst->m_height = 0;
        dst->m_pitch = 0;
        dst->m_total = 0;
        dst->m_comp_flags = 0xf;
        dst->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
        (dst->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
        (dst->m_pixel_buf).m_size = 0;
        (dst->m_pixel_buf).m_capacity = 0;
        local_98.m_source_gamma = 2.2;
        local_98.m_dst_width = local_a0;
        local_98.m_dst_height = local_9c;
        local_98.m_filter_scale = local_70->m_filter_scale;
        local_98._24_8_ = (ulong)(4 - ((src->m_comp_flags & 8) == 0)) << 0x20;
        local_98.m_wrapping = local_70->m_wrapping;
        local_98.m_srgb = local_70->m_srgb;
        local_98.m_pFilter = local_70->m_pFilter;
        local_98.m_multithreaded = local_70->m_multithreaded;
        bVar3 = image_utils::resample(src,dst,&local_98);
        if (bVar3) {
          if (local_70->m_renormalize == true) {
            image_utils::renorm_normal_map(dst);
          }
          dst->m_comp_flags = src->m_comp_flags;
          mip_level::assign(*local_c8.m_p[uVar8].m_p,dst,PIXEL_FMT_INVALID,
                            (*(local_a8->m_faces).m_p[uVar8].m_p)->m_orient_flags);
        }
        else {
          p = (dst->m_pixel_buf).m_p;
          if (p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(p);
          }
          crnlib_free(dst);
          if (local_c8.m_size != 0) {
            uVar9 = 0;
            do {
              dst = (image_u8 *)(uVar9 * 0x10);
              if (local_c8.m_p[uVar9].m_size != 0) {
                uVar10 = 0;
                do {
                  this_01 = local_c8.m_p[uVar9].m_p[uVar10];
                  if (this_01 != (mip_level *)0x0) {
                    mip_level::~mip_level(this_01);
                    crnlib_free(this_01);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 < local_c8.m_p[uVar9].m_size);
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < (local_c8._8_8_ & 0xffffffff));
          }
        }
        if (local_68.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(local_68.m_pixel_buf.m_p);
        }
        if (!bVar3) goto LAB_001334ec;
        uVar8 = uVar8 + 1;
        bVar3 = uVar8 < (local_c8._8_8_ & 0xffffffff);
        uVar9 = CONCAT71((int7)((ulong)dst >> 8),!bVar3);
        uVar6 = (uint)uVar9;
      } while (bVar3);
    }
    local_ac = uVar6;
    assign(local_a8,&local_c8);
LAB_001334ec:
    pvVar2 = local_c8.m_p;
    bVar5 = (byte)local_ac;
    if (local_c8.m_p != (vector<crnlib::mip_level_*> *)0x0) {
      uVar9 = local_c8._8_8_ & 0xffffffff;
      if (uVar9 != 0) {
        lVar7 = 0;
        do {
          p_00 = *(void **)((long)&pvVar2->m_p + lVar7);
          if (p_00 != (void *)0x0) {
            crnlib_free(p_00);
          }
          lVar7 = lVar7 + 0x10;
        } while (uVar9 << 4 != lVar7);
      }
      crnlib_free(local_c8.m_p);
    }
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool mipmapped_texture::resize(uint new_width, uint new_height, const resample_params& params) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  CRNLIB_ASSERT((new_width >= 1) && (new_height >= 1));

  face_vec faces(get_num_faces());
  for (uint f = 0; f < faces.size(); f++) {
    faces[f].resize(1);
    faces[f][0] = crnlib_new<mip_level>();
  }

  for (uint f = 0; f < faces.size(); f++) {
    image_u8 tmp;
    image_u8* pImg = get_level(f, 0)->get_unpacked_image(tmp, cUnpackFlagUncook);

    image_u8* pMip = crnlib_new<image_u8>();

    image_utils::resample_params rparams;
    rparams.m_dst_width = new_width;
    rparams.m_dst_height = new_height;
    rparams.m_filter_scale = params.m_filter_scale;
    rparams.m_first_comp = 0;
    rparams.m_num_comps = pImg->is_component_valid(3) ? 4 : 3;
    rparams.m_srgb = params.m_srgb;
    rparams.m_wrapping = params.m_wrapping;
    rparams.m_pFilter = params.m_pFilter;
    rparams.m_multithreaded = params.m_multithreaded;

    if (!image_utils::resample(*pImg, *pMip, rparams)) {
      crnlib_delete(pMip);

      for (uint f = 0; f < faces.size(); f++)
        for (uint l = 0; l < faces[f].size(); l++)
          crnlib_delete(faces[f][l]);

      return false;
    }

    if (params.m_renormalize)
      image_utils::renorm_normal_map(*pMip);

    pMip->set_comp_flags(pImg->get_comp_flags());

    faces[f][0]->assign(pMip, PIXEL_FMT_INVALID, get_level(f, 0)->get_orientation_flags());
  }

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}